

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

ImU32 ImGui::GetColorU32(ImU32 col)

{
  float fVar1;
  ImU32 a;
  float style_alpha;
  ImU32 col_local;
  
  fVar1 = (GImGui->Style).Alpha;
  style_alpha = (float)col;
  if (fVar1 < 1.0) {
    style_alpha = (float)(col & 0xffffff | (int)(long)((float)(col >> 0x18) * fVar1) << 0x18);
  }
  return (ImU32)style_alpha;
}

Assistant:

ImU32 ImGui::GetColorU32(ImU32 col)
{
    float style_alpha = GImGui->Style.Alpha;
    if (style_alpha >= 1.0f)
        return col;
    ImU32 a = (col & IM_COL32_A_MASK) >> IM_COL32_A_SHIFT;
    a = (ImU32)(a * style_alpha); // We don't need to clamp 0..255 because Style.Alpha is in 0..1 range.
    return (col & ~IM_COL32_A_MASK) | (a << IM_COL32_A_SHIFT);
}